

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void psocks_cmdline(psocks_state *ps,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char **ppcVar6;
  char *p;
  size_t args_seen;
  _Bool accumulating_exec_args;
  char **ppcStack_20;
  _Bool doing_opts;
  char **argv_local;
  int argc_local;
  psocks_state *ps_local;
  
  bVar1 = true;
  bVar2 = false;
  p = (char *)0x0;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                iVar3 = argv_local._4_4_ + -1;
                if (iVar3 < 1) {
                  return;
                }
                ppcVar6 = ppcStack_20 + 1;
                pcVar5 = ppcStack_20[1];
                if (((bVar1) && (*pcVar5 == '-')) && (pcVar5[1] != '\0')) break;
                if (bVar2) {
                  BinarySink_put_asciz(ps->subcmd->binarysink_,pcVar5);
                  ppcStack_20 = ppcVar6;
                  argv_local._4_4_ = iVar3;
                }
                else {
                  if (p != (char *)0x0) {
                    fprintf(_stderr,"psocks: unexpected extra argument \'%s\'\n",pcVar5);
                    exit(1);
                  }
                  iVar4 = atoi(pcVar5);
                  ps->listen_port = iVar4;
                  p = p + 1;
                  ppcStack_20 = ppcVar6;
                  argv_local._4_4_ = iVar3;
                }
              }
              iVar4 = strcmp(pcVar5,"--");
              if (iVar4 != 0) break;
              bVar1 = false;
              ppcStack_20 = ppcVar6;
              argv_local._4_4_ = iVar3;
            }
            iVar4 = strcmp(pcVar5,"-g");
            if (iVar4 != 0) break;
            ps->acceptall = true;
            ppcStack_20 = ppcVar6;
            argv_local._4_4_ = iVar3;
          }
          iVar4 = strcmp(pcVar5,"-d");
          if (iVar4 != 0) break;
          ps->log_flags = ps->log_flags | 2;
          ppcStack_20 = ppcVar6;
          argv_local._4_4_ = iVar3;
        }
        iVar4 = strcmp(pcVar5,"-f");
        if (iVar4 != 0) break;
        ps->rec_dest = REC_FILE;
        ppcStack_20 = ppcVar6;
        argv_local._4_4_ = iVar3;
      }
      iVar4 = strcmp(pcVar5,"-p");
      if (iVar4 == 0) break;
      iVar4 = strcmp(pcVar5,"--exec");
      if (iVar4 != 0) {
        iVar3 = strcmp(pcVar5,"--help");
        if (iVar3 != 0) {
          fprintf(_stderr,"psocks: unrecognised option \'%s\'\n",pcVar5);
          exit(1);
        }
        printf("usage: psocks [ -d ] [ -f");
        if (ps->platform->open_pipes !=
            (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
          printf(" | -p pipe-cmd");
        }
        printf(" ] [ -g ] port-number");
        printf("\n");
        printf("where: -d           log all connection contents to standard output\n");
        printf("       -f           record each half-connection to a file sockin.N/sockout.N\n");
        if (ps->platform->open_pipes !=
            (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
          printf("       -p pipe-cmd  pipe each half-connection to \'pipe-cmd [in|out] N\'\n");
        }
        printf("       -g           accept connections from anywhere, not just localhost\n");
        if (ps->platform->start_subcommand != (_func_void_strbuf_ptr *)0x0) {
          printf("       --exec subcmd [args...]   run command, and terminate when it exits\n");
        }
        printf("       port-number  listen on this port (default 1080)\n");
        printf("also: psocks --help      display this help text\n");
        exit(0);
      }
      if (ps->platform->start_subcommand == (_func_void_strbuf_ptr *)0x0) {
        fprintf(_stderr,"psocks: running a subcommand is not supported on this platform\n");
        exit(1);
      }
      bVar2 = true;
      bVar1 = false;
      ppcStack_20 = ppcVar6;
      argv_local._4_4_ = iVar3;
    }
    if (ps->platform->open_pipes ==
        (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
      fprintf(_stderr,"psocks: \'-p\' is not supported on this platform\n");
      exit(1);
    }
    if (argv_local._4_4_ + -2 < 1) break;
    pcVar5 = dupstr(ppcStack_20[2]);
    ps->rec_cmd = pcVar5;
    ps->rec_dest = REC_PIPE;
    ppcStack_20 = ppcStack_20 + 2;
    argv_local._4_4_ = argv_local._4_4_ + -2;
  }
  fprintf(_stderr,"psocks: expected an argument to \'-p\'\n");
  exit(1);
}

Assistant:

void psocks_cmdline(psocks_state *ps, int argc, char **argv)
{
    bool doing_opts = true;
    bool accumulating_exec_args = false;
    size_t args_seen = 0;

    while (--argc > 0) {
	const char *p = *++argv;

	if (doing_opts && p[0] == '-' && p[1]) {
            if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "-g")) {
		ps->acceptall = true;
            } else if (!strcmp(p, "-d")) {
		ps->log_flags |= LOG_DIALOGUE;
            } else if (!strcmp(p, "-f")) {
		ps->rec_dest = REC_FILE;
            } else if (!strcmp(p, "-p")) {
                if (!ps->platform->open_pipes) {
		    fprintf(stderr, "psocks: '-p' is not supported on this "
                            "platform\n");
		    exit(1);
                }
		if (--argc > 0) {
		    ps->rec_cmd = dupstr(*++argv);
		} else {
		    fprintf(stderr, "psocks: expected an argument to '-p'\n");
		    exit(1);
		}
		ps->rec_dest = REC_PIPE;
	    } else if (!strcmp(p, "--exec")) {
                if (!ps->platform->start_subcommand) {
		    fprintf(stderr, "psocks: running a subcommand is not "
                            "supported on this platform\n");
		    exit(1);
                }
                accumulating_exec_args = true;
                /* Now consume all further argv words for the
                 * subcommand, even if they look like options */
                doing_opts = false;
	    } else if (!strcmp(p, "--help")) {
                printf("usage: psocks [ -d ] [ -f");
                if (ps->platform->open_pipes)
                    printf(" | -p pipe-cmd");
                printf(" ] [ -g ] port-number");
                printf("\n");
                printf("where: -d           log all connection contents to"
                       " standard output\n");
                printf("       -f           record each half-connection to "
                       "a file sockin.N/sockout.N\n");
                if (ps->platform->open_pipes)
                    printf("       -p pipe-cmd  pipe each half-connection"
                           " to 'pipe-cmd [in|out] N'\n");
                printf("       -g           accept connections from anywhere,"
                       " not just localhost\n");
                if (ps->platform->start_subcommand)
                    printf("       --exec subcmd [args...]   run command, and "
                           "terminate when it exits\n");
                printf("       port-number  listen on this port"
                       " (default 1080)\n");
                printf("also: psocks --help      display this help text\n");
                exit(0);
            } else {
                fprintf(stderr, "psocks: unrecognised option '%s'\n", p);
                exit(1);
            }
	} else {
            if (accumulating_exec_args) {
                put_asciz(ps->subcmd, p);
            } else switch (args_seen++) {
              case 0:
                ps->listen_port = atoi(p);
                break;
              default:
                fprintf(stderr, "psocks: unexpected extra argument '%s'\n", p);
                exit(1);
                break;
            }
	}
    }
}